

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func)

{
  int iVar1;
  SQSharedState *ss;
  SQOuterVar *pSVar2;
  SQWeakRef *root;
  SQClosure *x;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  ss = this->_sharedstate;
  root = SQRefCounted::GetWeakRef((this->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
  x = SQClosure::Create(ss,func,root);
  lVar5 = func->_noutervalues;
  if (lVar5 != 0) {
    lVar4 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar4;
    }
    lVar3 = 0x20;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      pSVar2 = func->_outervalues;
      iVar1 = *(int *)((long)pSVar2 + lVar3 + -0x20);
      if (iVar1 == 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(x->_outervalues->super_SQObject)._type + lVar4),
                   ((this->ci->_closure).super_SQObject._unVal.pClosure)->_outervalues +
                   *(long *)((long)&pSVar2->_type + lVar3));
      }
      else if (iVar1 == 0) {
        FindOuter(this,(SQObjectPtr *)((long)&(x->_outervalues->super_SQObject)._type + lVar4),
                  (this->_stack)._vals + this->_stackbase + *(long *)((long)&pSVar2->_type + lVar3))
        ;
      }
      lVar3 = lVar3 + 0x28;
      lVar4 = lVar4 + 0x10;
    }
  }
  lVar5 = func->_ndefaultparams;
  if (lVar5 != 0) {
    lVar4 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar4;
    }
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
      SQObjectPtr::operator=
                ((SQObjectPtr *)((long)&(x->_defaultparams->super_SQObject)._type + lVar4),
                 (this->_stack)._vals + this->_stackbase + func->_defaultparams[lVar3]);
      lVar4 = lVar4 + 0x10;
    }
  }
  SQObjectPtr::operator=(target,x);
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
    target = closure;
    return true;

}